

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Read<int> __thiscall Omega_h::array_cast<int,signed_char>(Omega_h *this,Read<signed_char> *in)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  LO LVar2;
  Read<int> RVar3;
  type f;
  Write<int> out;
  allocator local_59;
  string local_58;
  Write<int> local_38;
  Write<int> local_28;
  
  pAVar1 = (in->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    LVar2 = (LO)pAVar1->size;
  }
  else {
    LVar2 = (LO)((ulong)pAVar1 >> 3);
  }
  std::__cxx11::string::string((string *)&local_58,"",&local_59);
  Write<int>::Write(&local_38,LVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  Write<int>::Write((Write<int> *)&local_58,&local_38);
  Write<signed_char>::Write((Write<signed_char> *)&local_58.field_2,&in->write_);
  pAVar1 = (in->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    LVar2 = (LO)pAVar1->size;
  }
  else {
    LVar2 = (LO)((ulong)pAVar1 >> 3);
  }
  parallel_for<Omega_h::array_cast<int,signed_char>(Omega_h::Read<signed_char>)::_lambda(int)_1_>
            (LVar2,(type *)&local_58,"array_cast");
  Write<int>::Write(&local_28,&local_38);
  Read<int>::Read((Read<signed_char> *)this,&local_28);
  Write<int>::~Write(&local_28);
  array_cast<int,signed_char>(Omega_h::Read<signed_char>)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)&local_58);
  Write<int>::~Write(&local_38);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar3.write_.shared_alloc_;
}

Assistant:

Read<Tout> array_cast(Read<Tin> in) {
  auto out = Write<Tout>(in.size());
  auto f = OMEGA_H_LAMBDA(LO i) { out[i] = static_cast<Tout>(in[i]); };
  parallel_for(in.size(), f, "array_cast");
  return out;
}